

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_erterm_enc(opj_mqc_t *mqc)

{
  opj_mqc_t *in_RDI;
  int k;
  int local_c;
  
  for (local_c = 0xc - in_RDI->ct; 0 < local_c; local_c = local_c - in_RDI->ct) {
    in_RDI->c = in_RDI->c << ((byte)in_RDI->ct & 0x1f);
    in_RDI->ct = 0;
    mqc_byteout(in_RDI);
  }
  if (*in_RDI->bp != 0xff) {
    mqc_byteout(in_RDI);
  }
  return;
}

Assistant:

void mqc_erterm_enc(opj_mqc_t *mqc) {
	int k = 11 - mqc->ct + 1;
	
	while (k > 0) {
		mqc->c <<= mqc->ct;
		mqc->ct = 0;
		mqc_byteout(mqc);
		k -= mqc->ct;
	}
	
	if (*mqc->bp != 0xff) {
		mqc_byteout(mqc);
	}
}